

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd.c
# Opt level: O2

ssize_t hd_inflate_read_len(nghttp2_hd_inflater *inflater,int *rfin,uint8_t *in,uint8_t *last,
                           size_t prefix,size_t maxlen)

{
  undefined8 in_RAX;
  ssize_t sVar1;
  ssize_t sVar2;
  uint32_t out;
  
  out = (uint32_t)((ulong)in_RAX >> 0x20);
  *rfin = 0;
  sVar1 = decode_length(&out,&inflater->shift,rfin,(uint32_t)inflater->left,inflater->shift,in,last,
                        prefix);
  sVar2 = -0x20b;
  if ((sVar1 != -1) && (out <= maxlen)) {
    inflater->left = (ulong)out;
    sVar2 = sVar1;
  }
  return sVar2;
}

Assistant:

static ssize_t hd_inflate_read_len(nghttp2_hd_inflater *inflater, int *rfin,
                                   const uint8_t *in, const uint8_t *last,
                                   size_t prefix, size_t maxlen) {
  ssize_t rv;
  uint32_t out;

  *rfin = 0;

  rv = decode_length(&out, &inflater->shift, rfin, (uint32_t)inflater->left,
                     inflater->shift, in, last, prefix);

  if (rv == -1) {
    DEBUGF("inflatehd: integer decoding failed\n");
    return NGHTTP2_ERR_HEADER_COMP;
  }

  if (out > maxlen) {
    DEBUGF("inflatehd: integer exceeded the maximum value %zu\n", maxlen);
    return NGHTTP2_ERR_HEADER_COMP;
  }

  inflater->left = out;

  DEBUGF("inflatehd: decoded integer is %u\n", out);

  return rv;
}